

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O0

void DummyReadReplyHandler
               (CManager cm,CMConnection conn,void *msg_v,void *client_Data,attr_list attrs)

{
  long lVar1;
  void *__ptr;
  long lVar2;
  undefined8 *in_RCX;
  long in_RDX;
  undefined8 in_RDI;
  DummyCompletionHandle Handle;
  CP_Services Svcs;
  Dummy_RS_Stream RS_Stream;
  DummyReadReplyMsg ReadReplyMsg;
  char *tmpstr;
  
  if (_perfstubs_initialized == 1) {
    if (DummyReadReplyHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/dp/dummy_dp.c"
                                          ,"DummyReadReplyHandler",0x10f);
      DummyReadReplyHandler::timer = (void *)ps_timer_create_(__ptr);
      free(__ptr);
    }
    ps_timer_start_(DummyReadReplyHandler::timer);
  }
  lVar1 = *(long *)(in_RDX + 0x10);
  lVar2 = CMCondition_get_client_data(in_RDI,*(undefined4 *)(in_RDX + 0x20));
  (*(code *)*in_RCX)(*(undefined8 *)(lVar1 + 8),5,
                     "Got a reply to remote memory read from rank %d, condition is %d\n",
                     *(undefined4 *)(lVar2 + 0x20),*(undefined4 *)(in_RDX + 0x20));
  memcpy(*(void **)(lVar2 + 0x18),*(void **)(in_RDX + 0x18),*(size_t *)(in_RDX + 8));
  CMCondition_signal(in_RDI,*(undefined4 *)(in_RDX + 0x20));
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(DummyReadReplyHandler::timer);
  }
  return;
}

Assistant:

static void DummyReadReplyHandler(CManager cm, CMConnection conn, void *msg_v, void *client_Data,
                                  attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    DummyReadReplyMsg ReadReplyMsg = (DummyReadReplyMsg)msg_v;
    Dummy_RS_Stream RS_Stream = ReadReplyMsg->RS_Stream;
    CP_Services Svcs = (CP_Services)client_Data;
    DummyCompletionHandle Handle = CMCondition_get_client_data(cm, ReadReplyMsg->NotifyCondition);

    Svcs->verbose(RS_Stream->CP_Stream, DPTraceVerbose,
                  "Got a reply to remote memory read from rank %d, condition is %d\n", Handle->Rank,
                  ReadReplyMsg->NotifyCondition);

    /*
     * `Handle` contains the full request info and is `client_data`
     * associated with the CMCondition.  Once we get it, copy the incoming
     * data to the buffer area given by the request
     */
    memcpy(Handle->Buffer, ReadReplyMsg->Data, ReadReplyMsg->DataLength);

    /*
     * Signal the condition to wake the reader if they are waiting.
     */
    CMCondition_signal(cm, ReadReplyMsg->NotifyCondition);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}